

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncOutput(xmlOutputBufferPtr output,int init)

{
  xmlBufPtr buf_00;
  xmlCharEncodingHandler *pxVar1;
  uint uVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *in_00;
  size_t sVar5;
  byte *utf;
  int local_e4;
  char local_b8 [8];
  char buf [50];
  int charrefLen;
  int cur;
  xmlChar *content;
  uchar local_68 [4];
  int len;
  xmlChar charref [20];
  xmlBufPtr out;
  xmlBufPtr in;
  int c_out;
  int c_in;
  size_t toconv;
  size_t sStack_28;
  int writtentot;
  size_t written;
  int ret;
  int init_local;
  xmlOutputBufferPtr output_local;
  
  toconv._4_4_ = 0;
  if ((((output == (xmlOutputBufferPtr)0x0) || (output->encoder == (xmlCharEncodingHandlerPtr)0x0))
      || (output->buffer == (xmlBufPtr)0x0)) || (output->conv == (xmlBufPtr)0x0)) {
    return -1;
  }
  unique0x00012000 = output->conv;
  buf_00 = output->buffer;
  written._4_4_ = init;
  _ret = output;
LAB_0014f935:
  sStack_28 = xmlBufAvail(stack0xffffffffffffffb0);
  if (written._4_4_ != 0) {
    in._4_4_ = 0;
    in._0_4_ = (int)sStack_28;
    pxVar1 = _ret->encoder;
    pxVar4 = xmlBufEnd(stack0xffffffffffffffb0);
    xmlEncOutputChunk(pxVar1,pxVar4,(int *)&in,(uchar *)0x0,(int *)((long)&in + 4));
    xmlBufAddLen(stack0xffffffffffffffb0,(long)(int)in);
    return (int)in;
  }
  _c_out = xmlBufUse(buf_00);
  if (_c_out == 0) {
    return toconv._4_4_;
  }
  if (0x10000 < _c_out) {
    _c_out = 0x10000;
  }
  if (sStack_28 <= _c_out << 2) {
    xmlBufGrow(stack0xffffffffffffffb0,(int)(_c_out << 2));
    sStack_28 = xmlBufAvail(stack0xffffffffffffffb0);
  }
  if (0x40000 < sStack_28) {
    sStack_28 = 0x40000;
  }
  in._4_4_ = (int)_c_out;
  in._0_4_ = (int)sStack_28;
  pxVar1 = _ret->encoder;
  pxVar4 = xmlBufEnd(stack0xffffffffffffffb0);
  in_00 = xmlBufContent(buf_00);
  written._0_4_ = xmlEncOutputChunk(pxVar1,pxVar4,(int *)&in,in_00,(int *)((long)&in + 4));
  xmlBufShrink(buf_00,(long)in._4_4_);
  xmlBufAddLen(stack0xffffffffffffffb0,(long)(int)in);
  toconv._4_4_ = (int)in + toconv._4_4_;
  if ((int)written == -1) goto code_r0x0014fa92;
  goto LAB_0014faa4;
code_r0x0014fa92:
  if ((int)in < 1) {
    written._0_4_ = -3;
LAB_0014faa4:
    switch((int)written) {
    case 0:
      break;
    case -4:
      xmlEncodingErr(XML_I18N_NO_OUTPUT,"xmlCharEncOutFunc: no output function !\n",(char *)0x0);
      written._0_4_ = -1;
      break;
    case -3:
      break;
    case -2:
      sVar5 = xmlBufUse(buf_00);
      content._4_4_ = (int)sVar5;
      utf = xmlBufContent(buf_00);
      uVar2 = xmlGetUTF8Char(utf,(int *)((long)&content + 4));
      if (0 < (int)uVar2) {
        register0x00000000 = snprintf((char *)local_68,0x14,"&#%d;",(ulong)uVar2);
        xmlBufShrink(buf_00,(long)content._4_4_);
        xmlBufGrow(stack0xffffffffffffffb0,stack0xffffffffffffff80 << 2);
        sVar5 = xmlBufAvail(stack0xffffffffffffffb0);
        in._0_4_ = (int)sVar5;
        in._4_4_ = stack0xffffffffffffff80;
        pxVar1 = _ret->encoder;
        pxVar4 = xmlBufEnd(stack0xffffffffffffffb0);
        written._0_4_ = xmlEncOutputChunk(pxVar1,pxVar4,(int *)&in,local_68,(int *)((long)&in + 4));
        if ((-1 < (int)written) && (in._4_4_ == stack0xffffffffffffff80)) {
          xmlBufAddLen(stack0xffffffffffffffb0,(long)(int)in);
          toconv._4_4_ = (int)in + toconv._4_4_;
          goto LAB_0014f935;
        }
        snprintf(local_b8,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*utf,(ulong)utf[1],(ulong)utf[2]
                 ,(uint)utf[3]);
        buf[0x29] = '\0';
        xmlEncodingErr(XML_I18N_CONV_FAILED,"output conversion failed due to conv error, bytes %s\n"
                       ,local_b8);
        iVar3 = xmlBufGetAllocationScheme(buf_00);
        if (iVar3 != 2) {
          *utf = 0x20;
        }
      }
      break;
    case -1:
    }
    if (toconv._4_4_ == 0) {
      local_e4 = (int)written;
    }
    else {
      local_e4 = toconv._4_4_;
    }
    return local_e4;
  }
  goto LAB_0014f935;
}

Assistant:

int
xmlCharEncOutput(xmlOutputBufferPtr output, int init)
{
    int ret;
    size_t written;
    int writtentot = 0;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((output == NULL) || (output->encoder == NULL) ||
        (output->buffer == NULL) || (output->conv == NULL))
        return (-1);
    out = output->conv;
    in = output->buffer;

retry:

    written = xmlBufAvail(out);

    /*
     * First specific handling of the initialization call
     */
    if (init) {
        c_in = 0;
        c_out = written;
        /* TODO: Check return value. */
        xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                          NULL, &c_in);
        xmlBufAddLen(out, c_out);
#ifdef DEBUG_ENCODING
	xmlGenericError(xmlGenericErrorContext,
		"initialized encoder\n");
#endif
        return(c_out);
    }

    /*
     * Conversion itself.
     */
    toconv = xmlBufUse(in);
    if (toconv == 0)
        return (writtentot);
    if (toconv > 64 * 1024)
        toconv = 64 * 1024;
    if (toconv * 4 >= written) {
        xmlBufGrow(out, toconv * 4);
        written = xmlBufAvail(out);
    }
    if (written > 256 * 1024)
        written = 256 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                            xmlBufContent(in), &c_in);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    writtentot += c_out;
    if (ret == -1) {
        if (c_out > 0) {
            /* Can be a limitation of iconv or uconv */
            goto retry;
        }
        ret = -3;
    }

    /*
     * Attempt to handle error cases
     */
    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of output\n",
	            c_in, c_out);
#endif
	    break;
        case -1:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "output conversion failed by lack of space\n");
#endif
	    break;
        case -3:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of output %d left\n",
	            c_in, c_out, (int) xmlBufUse(in));
#endif
	    break;
        case -4:
            xmlEncodingErr(XML_I18N_NO_OUTPUT,
                           "xmlCharEncOutFunc: no output function !\n", NULL);
            ret = -1;
            break;
        case -2: {
	    xmlChar charref[20];
	    int len = xmlBufUse(in);
            xmlChar *content = xmlBufContent(in);
	    int cur, charrefLen;

	    cur = xmlGetUTF8Char(content, &len);
	    if (cur <= 0)
                break;

#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                    "handling output conversion error\n");
            xmlGenericError(xmlGenericErrorContext,
                    "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
                    content[0], content[1],
                    content[2], content[3]);
#endif
            /*
             * Removes the UTF8 sequence, and replace it by a charref
             * and continue the transcoding phase, hoping the error
             * did not mangle the encoder state.
             */
            charrefLen = snprintf((char *) &charref[0], sizeof(charref),
                             "&#%d;", cur);
            xmlBufShrink(in, len);
            xmlBufGrow(out, charrefLen * 4);
            c_out = xmlBufAvail(out);
            c_in = charrefLen;
            ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                                    charref, &c_in);

	    if ((ret < 0) || (c_in != charrefLen)) {
		char buf[50];

		snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
			 content[0], content[1],
			 content[2], content[3]);
		buf[49] = 0;
		xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "output conversion failed due to conv error, bytes %s\n",
			       buf);
		if (xmlBufGetAllocationScheme(in) != XML_BUFFER_ALLOC_IMMUTABLE)
		    content[0] = ' ';
                break;
	    }

            xmlBufAddLen(out, c_out);
            writtentot += c_out;
            goto retry;
	}
    }
    return(writtentot ? writtentot : ret);
}